

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

string * FIX::SocketException::errorToWhat_abi_cxx11_(void)

{
  int *piVar1;
  char *__s;
  string *in_RDI;
  allocator<char> local_9;
  
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_9);
  return in_RDI;
}

Assistant:

static std::string errorToWhat()
  {
#ifdef _MSC_VER
    int error = WSAGetLastError();
    char buffer[2048];
    FormatMessageA( FORMAT_MESSAGE_FROM_SYSTEM, NULL, error,
                   MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                   buffer, 2048, NULL );
    return buffer;
#else
    int error = errno;
    return strerror( error );
#endif
  }